

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O3

void __thiscall BmsNoteManager::SRandom(BmsNoteManager *this,uint seed,int s,int e)

{
  int iVar1;
  _Rb_tree_color bar;
  undefined8 uVar2;
  BmsWord BVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 uVar8;
  int iVar9;
  undefined4 *puVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  uint uVar14;
  BmsNote *pBVar15;
  int iVar16;
  long lVar17;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *this_00;
  int c;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>,_std::_Rb_tree_iterator<std::pair<const_int,_BmsNote>_>_>
  pVar22;
  BmsNote currentnote;
  bool iscurrent [20];
  bool isln [20];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  BmsNote currentrow [20];
  BmsNote local_388;
  BmsNote *local_368;
  _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
  *local_360;
  undefined4 *local_358;
  ulong local_350;
  long local_348;
  _Rb_tree_node_base *local_340;
  undefined1 local_338 [16];
  undefined4 local_328;
  undefined1 local_318 [16];
  undefined4 local_308;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2f8;
  undefined1 local_2c8 [16];
  BmsNote aBStack_2b8 [3];
  undefined4 auStack_258 [138];
  
  srand(seed);
  uVar18 = e - s;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2f8._M_impl.super__Rb_tree_header._M_header;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar17 = 0;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    BmsNoteLane::GetNoteExistBar
              ((BmsNoteLane *)(&this->lanes_[0].notes_ + lVar17),
               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_2f8);
    lVar17 = lVar17 + 0x30;
  } while (lVar17 != 0x3c0);
  local_318 = (undefined1  [16])0x0;
  local_308 = 0;
  if ((_Rb_tree_header *)local_2f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_2f8._M_impl.super__Rb_tree_header) {
    local_348 = (long)s;
    uVar14 = 0xffffffff;
    if (-1 < (int)uVar18) {
      uVar14 = uVar18;
    }
    local_350 = (ulong)uVar18 + 4 & 0xfffffffffffffffc;
    auVar19._4_4_ = 0;
    auVar19._0_4_ = uVar18;
    auVar19._8_4_ = uVar18;
    auVar19._12_4_ = 0;
    local_358 = auStack_258 + local_348 * 8;
    local_360 = (_Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                 *)(this->lanes_ + local_348);
    local_368 = aBStack_2b8 + local_348;
    local_2c8 = auVar19 ^ _DAT_00138030;
    p_Var12 = local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bar = p_Var12[1]._M_color;
      local_338 = (undefined1  [16])0x0;
      local_328 = 0;
      lVar17 = 0;
      do {
        BmsNote::BmsNote((BmsNote *)((long)&aBStack_2b8[0].type + lVar17));
        auVar7 = _DAT_00138030;
        auVar6 = _DAT_00138020;
        auVar19 = _DAT_00138010;
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x280);
      local_340 = p_Var12;
      if (s <= e) {
        uVar13 = 0;
        puVar10 = local_358;
        do {
          auVar20._8_4_ = (int)uVar13;
          auVar20._0_8_ = uVar13;
          auVar20._12_4_ = (int)(uVar13 >> 0x20);
          auVar21 = (auVar20 | auVar6) ^ auVar7;
          if ((bool)(~((int)local_2c8._4_4_ < auVar21._4_4_ ||
                      (int)local_2c8._0_4_ < auVar21._0_4_ && auVar21._4_4_ == local_2c8._4_4_) & 1)
             ) {
            puVar10[-0x18] = 0;
          }
          if (auVar21._12_4_ <= (int)local_2c8._12_4_ &&
              (auVar21._8_4_ <= (int)local_2c8._8_4_ || auVar21._12_4_ != local_2c8._12_4_)) {
            puVar10[-0x10] = 0;
          }
          auVar20 = (auVar20 | auVar19) ^ auVar7;
          iVar16 = auVar20._4_4_;
          if (iVar16 <= (int)local_2c8._4_4_ &&
              (iVar16 != local_2c8._4_4_ || auVar20._0_4_ <= (int)local_2c8._0_4_)) {
            puVar10[-8] = 0;
            *puVar10 = 0;
          }
          uVar13 = uVar13 + 4;
          puVar10 = puVar10 + 0x20;
        } while (local_350 != uVar13);
        lVar17 = local_348;
        if (s <= e) {
          do {
            BmsNoteLane::Get(&local_388,this->lanes_ + lVar17,bar);
            if (local_388.type != _S_red) {
              iVar9 = rand();
              iVar16 = uVar14 + 2;
              while( true ) {
                iVar9 = iVar9 % (int)(uVar18 + 1);
                iVar1 = iVar9 + s;
                if ((local_318[iVar1] == '\0') && (local_338[iVar1] != '\x01')) break;
                iVar9 = iVar9 + 1;
                iVar16 = iVar16 + -1;
                if (iVar16 == 0) {
                  __assert_fail("attempt <= keycount",
                                "/workspace/llm4binary/github/license_c_cmakelists/kuna[P]bmsbelplus/bmsbel/bms_note.cpp"
                                ,0x11b,"void BmsNoteManager::SRandom(unsigned int, int, int)");
                }
              }
              *(ulong *)&aBStack_2b8[iVar1].field_0xc =
                   CONCAT44(local_388.pos._0_4_,local_388._12_4_);
              *(undefined8 *)((long)&aBStack_2b8[iVar1].pos + 4) = local_388._20_8_;
              aBStack_2b8[iVar1].type = local_388.type;
              aBStack_2b8[iVar1].value = (BmsWord)local_388.value.value_;
              *(ulong *)&aBStack_2b8[iVar1].time = CONCAT44(local_388._12_4_,local_388.time);
              if (local_388.type == 2) {
                uVar8 = 1;
LAB_0012fdc9:
                local_318[iVar1] = uVar8;
              }
              else if (local_388.type == 3) {
                uVar8 = 0;
                goto LAB_0012fdc9;
              }
              local_338[iVar1] = 1;
            }
            BmsWord::~BmsWord(&local_388.value);
            lVar17 = lVar17 + 1;
          } while (e + 1 != (int)lVar17);
          pBVar15 = local_368;
          this_00 = local_360;
          iVar16 = uVar18 + 1;
          if (s <= e) {
            do {
              local_388.type = bar;
              pVar22 = std::
                       _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                       ::equal_range(this_00,&local_388.type);
              std::
              _Rb_tree<int,_std::pair<const_int,_BmsNote>,_std::_Select1st<std::pair<const_int,_BmsNote>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
              ::_M_erase_aux(this_00,(_Base_ptr)pVar22.first._M_node,
                             (_Base_ptr)pVar22.second._M_node);
              if (pBVar15->type != 0) {
                local_388.type = bar;
                pmVar11 = std::
                          map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                          ::operator[]((map<int,_BmsNote,_std::less<int>,_std::allocator<std::pair<const_int,_BmsNote>_>_>
                                        *)this_00,&local_388.type);
                iVar9 = pBVar15->type;
                BVar3.value_ = (pBVar15->value).value_;
                uVar4 = pBVar15->time;
                uVar5 = *(undefined4 *)&pBVar15->field_0xc;
                uVar2 = *(undefined8 *)((long)&pBVar15->pos + 4);
                *(undefined8 *)&pmVar11->field_0xc = *(undefined8 *)&pBVar15->field_0xc;
                *(undefined8 *)((long)&pmVar11->pos + 4) = uVar2;
                pmVar11->type = iVar9;
                pmVar11->value = (BmsWord)BVar3.value_;
                pmVar11->time = uVar4;
                *(undefined4 *)&pmVar11->field_0xc = uVar5;
              }
              this_00 = this_00 + 0x30;
              pBVar15 = pBVar15 + 1;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
        }
      }
      lVar17 = 0x264;
      do {
        BmsWord::~BmsWord((BmsWord *)((long)&aBStack_2b8[0].type + lVar17));
        lVar17 = lVar17 + -0x20;
      } while (lVar17 != -0x1c);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_340);
    } while ((_Rb_tree_header *)p_Var12 != &local_2f8._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_2f8);
  return;
}

Assistant:

void BmsNoteManager::SRandom(unsigned int seed, int s, int e) {
	// similar to HRandom
	// prepare
	srand(seed);
	int keycount = e - s + 1;
	int failure = 0;			// failed notecount to randomize
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	// start to iterate all bars
	bool isprev[_MAX_NOTE_LANE] = { false, };	// is there any note placed previously?
	bool isln[_MAX_NOTE_LANE] = { false, };		// is there occupying longnote currently?
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex row = *it;
		bool iscurrent[_MAX_NOTE_LANE] = { false, };
		BmsNote currentrow[_MAX_NOTE_LANE];
		int attempt = 0;
		// initalize row data
		for (int c = s; c <= e; c++) {
			currentrow[c].type = BmsNote::NOTE_NONE;
		}
		// make new row data
		for (int c = s; c <= e; c++) {
			attempt = 0;
			// check previous note data to check valid
			BmsNote currentnote = lanes_[c].Get(row);
			if (currentnote.type == BmsNote::NOTE_NONE) continue;

			/*
			 * find new lane to place note
			 * only difference(from HRANDOM) is here:
			 * we don't check isprev[] (is previously note existed?)
			 */
			int newlane = rand() % keycount + s;
			while (isln[newlane] || iscurrent[newlane]) {
				newlane = (newlane - s + 1) % keycount + s;
				attempt++;
				_ASSERT(attempt <= keycount);	// this shouldn't happen
			}
			// copy previous note data to new temp row
			currentrow[newlane] = currentnote;
			switch (currentnote.type) {
			case BmsNote::NOTE_LNSTART:
				isln[newlane] = true;
				break;
			case BmsNote::NOTE_LNEND:
				isln[newlane] = false;
				break;
			}
			iscurrent[newlane] = true;
		}
		// copy
		for (int c = s; c <= e; c++) {
			lanes_[c].Delete(row);
			if (currentrow[c].type != BmsNote::NOTE_NONE) 
				lanes_[c].Set(row, currentrow[c]);
		}
		memcpy(isprev, iscurrent, sizeof(isprev));
	}
}